

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O2

void Aig_TsiStatePrint(Aig_Tsi_t *p,uint *pState)

{
  if (0 < p->pAig->nRegs) {
    (*(code *)(&DAT_007a27d0 +
              *(int *)(&DAT_007a27d0 +
                      (ulong)((uint)((*pState & 1) != 0) + (*pState >> 1 & 1) * 2) * 4)))();
    return;
  }
  printf(" (0=%5d, 1=%5d, x=%5d)\n",0,0,0);
  return;
}

Assistant:

void Aig_TsiStatePrint( Aig_Tsi_t * p, unsigned * pState )
{
    int i, Value, nZeros = 0, nOnes = 0, nDcs = 0;
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
        if ( Value == 1 )
            printf( "0" ), nZeros++;
        else if ( Value == 2 )
            printf( "1" ), nOnes++;
        else if ( Value == 3 )
            printf( "x" ), nDcs++;
        else
            assert( 0 );
    }
    printf( " (0=%5d, 1=%5d, x=%5d)\n", nZeros, nOnes, nDcs );
}